

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O2

void duckdb::AggregateStateFinalize(DataChunk *input,ExpressionState *state_p,Vector *result)

{
  idx_t iVar1;
  _func_int **pp_Var2;
  ExportAggregateBindData *pEVar3;
  FunctionLocalState *pFVar4;
  reference this;
  ulong uVar5;
  _func_int *__dest;
  uint *puVar6;
  idx_t i;
  ulong uVar7;
  idx_t i_1;
  long lVar8;
  UnifiedVectorFormat state_data;
  AggregateInputData aggr_input_data;
  
  pEVar3 = ExportAggregateBindData::GetFrom(state_p);
  state_data.sel = (SelectionVector *)state_p[1]._vptr_ExpressionState;
  pFVar4 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->
                     ((optional_ptr<duckdb::FunctionLocalState,_true> *)&state_data);
  ArenaAllocator::Reset((ArenaAllocator *)(pFVar4 + 0x10));
  iVar1 = pEVar3->state_size;
  pp_Var2 = pFVar4[7]._vptr_FunctionLocalState;
  UnifiedVectorFormat::UnifiedVectorFormat(&state_data);
  this = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
  Vector::ToUnifiedFormat(this,input->count,&state_data);
  lVar8 = 0;
  uVar7 = 0;
  do {
    if (input->count <= uVar7) {
      aggr_input_data.bind_data.ptr = (FunctionData *)0x0;
      aggr_input_data.combine_type = PRESERVE_INPUT;
      aggr_input_data.allocator = (ArenaAllocator *)(pFVar4 + 0x10);
      (*(pEVar3->aggr).finalize)((Vector *)(pFVar4 + 3),&aggr_input_data,result,input->count,0);
      for (uVar7 = 0; uVar7 < input->count; uVar7 = uVar7 + 1) {
        uVar5 = uVar7;
        if ((state_data.sel)->sel_vector != (sel_t *)0x0) {
          uVar5 = (ulong)(state_data.sel)->sel_vector[uVar7];
        }
        if ((state_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
             (unsigned_long *)0x0) &&
           ((state_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [uVar5 >> 6] >> (uVar5 & 0x3f) & 1) == 0)) {
          FlatVector::SetNull(result,uVar7,true);
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&state_data);
      return;
    }
    uVar5 = uVar7;
    if ((state_data.sel)->sel_vector != (sel_t *)0x0) {
      uVar5 = (ulong)(state_data.sel)->sel_vector[uVar7];
    }
    puVar6 = (uint *)(state_data.data + uVar5 * 0x10);
    __dest = (_func_int *)((long)pFVar4[2]._vptr_FunctionLocalState + lVar8);
    if (state_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
LAB_00847cbd:
      if (*puVar6 < 0xd) {
        puVar6 = puVar6 + 1;
      }
      else {
        puVar6 = *(uint **)(puVar6 + 2);
      }
      switchD_00917c1c::default(__dest,puVar6,pEVar3->state_size);
    }
    else {
      if ((state_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6]
           >> (uVar5 & 0x3f) & 1) != 0) goto LAB_00847cbd;
      (*(pEVar3->aggr).initialize)(&pEVar3->aggr,(data_ptr_t)__dest);
    }
    pp_Var2[uVar7] = __dest;
    uVar7 = uVar7 + 1;
    lVar8 = lVar8 + (iVar1 + 7 & 0xfffffffffffffff8);
  } while( true );
}

Assistant:

static void AggregateStateFinalize(DataChunk &input, ExpressionState &state_p, Vector &result) {
	auto &bind_data = ExportAggregateBindData::GetFrom(state_p);
	auto &local_state = ExecuteFunctionState::GetFunctionState(state_p)->Cast<FinalizeState>();
	local_state.allocator.Reset();

	D_ASSERT(bind_data.state_size == bind_data.aggr.state_size(bind_data.aggr));
	D_ASSERT(input.data.size() == 1);
	D_ASSERT(input.data[0].GetType().id() == LogicalTypeId::AGGREGATE_STATE);
	auto aligned_state_size = AlignValue(bind_data.state_size);

	auto state_vec_ptr = FlatVector::GetData<data_ptr_t>(local_state.addresses);

	UnifiedVectorFormat state_data;
	input.data[0].ToUnifiedFormat(input.size(), state_data);
	for (idx_t i = 0; i < input.size(); i++) {
		auto state_idx = state_data.sel->get_index(i);
		auto state_entry = UnifiedVectorFormat::GetData<string_t>(state_data) + state_idx;
		auto target_ptr = char_ptr_cast(local_state.state_buffer.get()) + aligned_state_size * i;

		if (state_data.validity.RowIsValid(state_idx)) {
			D_ASSERT(state_entry->GetSize() == bind_data.state_size);
			memcpy((void *)target_ptr, state_entry->GetData(), bind_data.state_size);
		} else {
			// create a dummy state because finalize does not understand NULLs in its input
			// we put the NULL back in explicitly below
			bind_data.aggr.initialize(bind_data.aggr, data_ptr_cast(target_ptr));
		}
		state_vec_ptr[i] = data_ptr_cast(target_ptr);
	}

	AggregateInputData aggr_input_data(nullptr, local_state.allocator);
	bind_data.aggr.finalize(local_state.addresses, aggr_input_data, result, input.size(), 0);

	for (idx_t i = 0; i < input.size(); i++) {
		auto state_idx = state_data.sel->get_index(i);
		if (!state_data.validity.RowIsValid(state_idx)) {
			FlatVector::SetNull(result, i, true);
		}
	}
}